

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcache.hpp
# Opt level: O3

int __thiscall
CorUnix::CSHRSynchCache<CorUnix::CSynchData>::Get
          (CSHRSynchCache<CorUnix::CSynchData> *this,CPalThread *pthrCurrent,int n,
          SHMPTR *shridpObjs)

{
  SHMPTR SVar1;
  LPVOID pvVar2;
  _USHRSynchCacheStackNode *p_Var3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  InternalEnterCriticalSection(pthrCurrent,&this->m_cs);
  p_Var3 = (this->m_pHead).m_val;
  uVar5 = (ulong)(uint)n;
  uVar7 = 0;
  if (0 < n && p_Var3 != (_USHRSynchCacheStackNode *)0x0) {
    uVar7 = 0;
    do {
      shridpObjs[uVar7] = *(SHMPTR *)((long)p_Var3 + 8);
      p_Var3 = (p_Var3->pointers).pNext;
      uVar7 = uVar7 + 1;
      if (p_Var3 == (_USHRSynchCacheStackNode *)0x0) break;
    } while (uVar7 < uVar5);
  }
  (this->m_pHead).m_val = p_Var3;
  iVar6 = (int)uVar7;
  (this->m_iDepth).m_val = (this->m_iDepth).m_val - iVar6;
  if (((this->m_pHead).m_val == (_USHRSynchCacheStackNode *)0x0) && ((this->m_iDepth).m_val != 0)) {
    fprintf(_stderr,"SYNCCACHE: Invalid cache depth value");
    DebugBreak();
  }
  if (((this->m_iDepth).m_val == 0) && (0 < this->m_iMaxDepth / 10 + (iVar6 - n))) {
    iVar4 = 0;
    do {
      SVar1 = SHMalloc(0x58);
      if (SVar1 == 0) {
        Flush(this,pthrCurrent,true);
        break;
      }
      p_Var3 = (_USHRSynchCacheStackNode *)SHMPtrToPtr(SVar1);
      memset(p_Var3,0,0x58);
      (p_Var3->pointers).shrid = SVar1;
      (p_Var3->pointers).pNext = (this->m_pHead).m_val;
      (this->m_pHead).m_val = p_Var3;
      (this->m_iDepth).m_val = (this->m_iDepth).m_val + 1;
      iVar4 = iVar4 + 1;
    } while (iVar4 < this->m_iMaxDepth / 10 + (iVar6 - n));
  }
  InternalLeaveCriticalSection(pthrCurrent,&this->m_cs);
  if (iVar6 < n) {
    uVar8 = uVar7 & 0xffffffff;
    do {
      SVar1 = SHMalloc(0x58);
      uVar7 = uVar8;
      if (SVar1 == 0) break;
      pvVar2 = SHMPtrToPtr(SVar1);
      memset(pvVar2,0,0x58);
      shridpObjs[uVar8] = SVar1;
      uVar8 = uVar8 + 1;
      uVar7 = uVar5;
    } while (uVar5 != uVar8);
  }
  if ((int)uVar7 != 0) {
    uVar5 = 0;
    do {
      pvVar2 = SHMPtrToPtr(shridpObjs[uVar5]);
      *(undefined4 *)((long)pvVar2 + 0x10) = 0;
      *(undefined8 *)((long)pvVar2 + 0x18) = 0;
      *(undefined8 *)((long)pvVar2 + 0x28) = 1;
      *(undefined8 *)((long)pvVar2 + 0x30) = 0;
      *(undefined4 *)((long)pvVar2 + 0x38) = 0;
      *(undefined8 *)((long)pvVar2 + 0x40) = 0;
      *(undefined8 *)((long)pvVar2 + 0x48) = 0;
      *(undefined1 *)((long)pvVar2 + 0x50) = 0;
      uVar5 = uVar5 + 1;
    } while ((uVar7 & 0xffffffff) != uVar5);
  }
  return (int)uVar7;
}

Assistant:

int Get(CPalThread * pthrCurrent, int n, SharedID * shridpObjs)
        {
            SharedID shridObj;
            void * pvObjRaw = NULL;
            USHRSynchCacheStackNode * pNode;
            int i = 0, j, k;

            Lock(pthrCurrent);
            pNode = m_pHead;
            while (pNode && i < n)
            {            
                shridpObjs[i] = pNode->pointers.shrid;
                pvObjRaw = (void *)pNode;
                pNode = pNode->pointers.pNext;
                i++;
            }
            m_pHead = pNode;
            m_iDepth -= i;

#ifdef _DEBUG
            if (NULL == m_pHead && m_iDepth != 0)
            {
                    // Can't use ASSERT here, since this is header
                    // (see comment above)
                    fprintf(stderr,"SYNCCACHE: Invalid cache depth value");
                    DebugBreak();
            }
#endif // _DEBUG

            if (0 == m_iDepth)
            {
                for (k=0; k<m_iMaxDepth/PreAllocFactor-n+i; k++)
                {
                    shridObj = RawSharedObjectAlloc(sizeof(USHRSynchCacheStackNode), DefaultSharedPool);
                    if (NULLSharedID == shridObj)
                    {
                        Flush(pthrCurrent, true);
                        break;
                    }
                    pNode = SharedIDToTypePointer(USHRSynchCacheStackNode, shridObj);
#ifdef _DEBUG
                    memset(reinterpret_cast<void*>(pNode), 0, sizeof(USHRSynchCacheStackNode));
#endif
                    pNode->pointers.shrid = shridObj;
                    pNode->pointers.pNext = m_pHead;
                    m_pHead = pNode;
                    m_iDepth++;
                }
            }

            Unlock(pthrCurrent);       

            for (j=i;j<n;j++)
            {
                shridObj = RawSharedObjectAlloc(sizeof(USHRSynchCacheStackNode), DefaultSharedPool);
                if (NULLSharedID == shridObj)
                    break;
#ifdef _DEBUG
                pvObjRaw = SharedIDToPointer(shridObj);                
                memset(pvObjRaw, 0, sizeof(USHRSynchCacheStackNode));                
#endif
                shridpObjs[j] = shridObj;
            }
            
            for (i=0;i<j;i++)
            {           
                pvObjRaw = SharedIDToPointer(shridpObjs[i]);                
                new (pvObjRaw) T;            
            }
            
            return j;
        }